

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall
TestRegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists::Run
          (TestRegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists *this)

{
  path *lhs;
  __type _Var1;
  runtime_error *this_00;
  string expectedOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  path local_470;
  path local_450;
  path local_430;
  ostringstream oss;
  TemporaryWorkingDirectory workdir;
  Component comp;
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory(&workdir,(this->super_Test).name);
  boost::filesystem::path::path((path *)&oss,"MyComponent");
  lhs = &workdir.workDir;
  boost::filesystem::operator/(&comp.root,lhs,(path *)&oss);
  boost::filesystem::create_directories(&comp.root);
  std::__cxx11::string::~string((string *)&comp);
  std::__cxx11::string::~string((string *)&oss);
  boost::filesystem::path::path((path *)&expectedOutput,"MyComponent");
  boost::filesystem::operator/((path *)&oss,lhs,(path *)&expectedOutput);
  boost::filesystem::path::path((path *)&local_490,"SubComponentA");
  boost::filesystem::operator/(&comp.root,(path *)&oss,(path *)&local_490);
  boost::filesystem::create_directories(&comp.root);
  std::__cxx11::string::~string((string *)&comp);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&expectedOutput);
  boost::filesystem::path::path(&local_430,"MyComponent");
  boost::filesystem::operator/((path *)&local_490,lhs,&local_430);
  boost::filesystem::path::path(&local_450,"SubComponentA");
  boost::filesystem::operator/((path *)&expectedOutput,(path *)&local_490,&local_450);
  boost::filesystem::path::path(&local_470,"CMakeLists.txt");
  boost::filesystem::operator/((path *)&oss,(path *)&expectedOutput,&local_470);
  std::ofstream::ofstream(&comp,_oss,_S_out);
  std::ofstream::close();
  std::ofstream::~ofstream(&comp);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&expectedOutput);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_430);
  boost::filesystem::path::path((path *)&expectedOutput,"MyComponent");
  boost::filesystem::operator/((path *)&oss,lhs,(path *)&expectedOutput);
  boost::filesystem::path::path((path *)&local_490,"SubComponentB");
  boost::filesystem::operator/(&comp.root,(path *)&oss,(path *)&local_490);
  boost::filesystem::create_directories(&comp.root);
  std::__cxx11::string::~string((string *)&comp);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&expectedOutput);
  boost::filesystem::path::path(&local_430,"MyComponent");
  boost::filesystem::operator/((path *)&local_490,lhs,&local_430);
  boost::filesystem::path::path(&local_450,"SubComponentB");
  boost::filesystem::operator/((path *)&expectedOutput,(path *)&local_490,&local_450);
  boost::filesystem::path::path(&local_470,"CMakeLists.txt");
  boost::filesystem::operator/((path *)&oss,(path *)&expectedOutput,&local_470);
  std::ofstream::ofstream(&comp,_oss,_S_out);
  std::ofstream::close();
  std::ofstream::~ofstream(&comp);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&expectedOutput);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_430);
  boost::filesystem::path::path((path *)&expectedOutput,"MyComponent");
  boost::filesystem::operator/((path *)&oss,lhs,(path *)&expectedOutput);
  boost::filesystem::path::path((path *)&local_490,"Data");
  boost::filesystem::operator/(&comp.root,(path *)&oss,(path *)&local_490);
  boost::filesystem::create_directories(&comp.root);
  std::__cxx11::string::~string((string *)&comp);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&expectedOutput);
  boost::filesystem::path::path((path *)&oss,"./MyComponent/");
  Component::Component(&comp,(path *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string
            ((string *)&expectedOutput,
             "add_subdirectory(SubComponentA)\nadd_subdirectory(SubComponentB)\n",(allocator *)&oss)
  ;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  RegenerateCmakeAddSubdirectory((ostream *)&oss,&comp);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_490,&expectedOutput);
  std::__cxx11::string::~string((string *)&local_490);
  if (_Var1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::string::~string((string *)&expectedOutput);
    Component::~Component(&comp);
    TemporaryWorkingDirectory::~TemporaryWorkingDirectory(&workdir);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_SubDirsWithAndWithoutCmakeLists) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");
  filesystem::create_directories(workdir() / "MyComponent" / "SubComponentA");
  std::ofstream((workdir() / "MyComponent" / "SubComponentA" / "CMakeLists.txt").c_str()).close();
  filesystem::create_directories(workdir() / "MyComponent" / "SubComponentB");
  std::ofstream((workdir() / "MyComponent" / "SubComponentB" / "CMakeLists.txt").c_str()).close();
  filesystem::create_directories(workdir() / "MyComponent" / "Data");

  Component comp("./MyComponent/");

  const std::string expectedOutput(
    "add_subdirectory(SubComponentA)\n"
    "add_subdirectory(SubComponentB)\n");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}